

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O1

void __thiscall
duckdb::GeoParquetFileMetadata::Write(GeoParquetFileMetadata *this,FileMetaData *file_meta_data)

{
  yyjson_str_pool *pyVar1;
  yyjson_alc *alc;
  yyjson_val_pool *pyVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  yyjson_val_uni yVar4;
  pointer pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  _Hash_node_base *__s;
  _func_void_void_ptr_void_ptr *p_Var9;
  void *pvVar10;
  FileMetaData *pFVar11;
  yyjson_mut_doc *doc;
  size_t sVar12;
  char *pcVar13;
  _Rb_tree_node_base *p_Var14;
  yyjson_doc *pyVar15;
  yyjson_mut_val *pyVar16;
  yyjson_mut_val *pyVar17;
  InvalidInputException *this_00;
  SerializationException *this_01;
  yyjson_mut_val *pyVar18;
  yyjson_mut_val *pyVar19;
  _Hash_node_base *p_Var20;
  bool bVar21;
  yyjson_mut_val *local_d8;
  string local_c0;
  FileMetaData *local_a0;
  size_t len;
  KeyValue kv;
  yyjson_write_err err;
  
  pyVar19 = (yyjson_mut_val *)0x0;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar2 = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,&doc->alc,1), bVar21)) {
      pyVar19 = pyVar2->cur;
      pyVar2->cur = pyVar19 + 1;
    }
    else {
      pyVar19 = (yyjson_mut_val *)0x0;
    }
    if (pyVar19 == (yyjson_mut_val *)0x0) {
      pyVar19 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar19->tag = 7;
    }
  }
  local_a0 = file_meta_data;
  if ((((doc != (yyjson_mut_doc *)0x0) && (doc->root = pyVar19, pyVar19 != (yyjson_mut_val *)0x0))
      && (pcVar5 = (this->version)._M_dataplus._M_p, pcVar5 != (pointer)0x0)) &&
     ((~(uint)pyVar19->tag & 7) == 0)) {
    uVar6 = (this->version)._M_string_length;
    pyVar2 = &doc->val_pool;
    if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
       (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,&doc->alc,2), bVar21)) {
      pyVar16 = pyVar2->cur;
      pyVar2->cur = pyVar16 + 2;
    }
    else {
      pyVar16 = (yyjson_mut_val *)0x0;
    }
    if (pyVar16 != (yyjson_mut_val *)0x0) {
      uVar7 = pyVar19->tag;
      pyVar16->tag = 0x70d;
      (pyVar16->uni).str = "version";
      pyVar1 = &doc->str_pool;
      if ((uVar6 < (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) ||
         (bVar21 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar1,&doc->alc,uVar6 + 1), bVar21))
      {
        pcVar13 = pyVar1->cur;
        pyVar1->cur = pcVar13 + uVar6 + 1;
      }
      else {
        pcVar13 = (char *)0x0;
      }
      if (pcVar13 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        switchD_015ff80e::default(pcVar13,pcVar5,uVar6);
        pcVar13[uVar6] = '\0';
      }
      pyVar16[1].uni.ptr = pcVar13;
      if (pcVar13 != (char *)0x0) {
        pyVar16[1].tag = uVar6 << 8 | 5;
        pyVar17 = pyVar16;
        if (0xff < uVar7) {
          lVar8 = *(long *)((pyVar19->uni).u64 + 0x10);
          pyVar17 = *(yyjson_mut_val **)(lVar8 + 0x10);
          *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar16;
        }
        pyVar16[1].next = pyVar17;
        pyVar16->next = pyVar16 + 1;
        (pyVar19->uni).str = (char *)pyVar16;
        pyVar19->tag = (uVar7 & 0xffffffffffffff00) + (ulong)(byte)pyVar19->tag + 0x100;
      }
    }
  }
  if ((((doc != (yyjson_mut_doc *)0x0) && (pyVar19 != (yyjson_mut_val *)0x0)) &&
      (pcVar5 = (this->primary_geometry_column)._M_dataplus._M_p, pcVar5 != (pointer)0x0)) &&
     ((~(uint)pyVar19->tag & 7) == 0)) {
    uVar6 = (this->primary_geometry_column)._M_string_length;
    pyVar2 = &doc->val_pool;
    if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
       (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,&doc->alc,2), bVar21)) {
      pyVar16 = pyVar2->cur;
      pyVar2->cur = pyVar16 + 2;
    }
    else {
      pyVar16 = (yyjson_mut_val *)0x0;
    }
    if (pyVar16 != (yyjson_mut_val *)0x0) {
      uVar7 = pyVar19->tag;
      pyVar16->tag = 0xe0d;
      (pyVar16->uni).str = "primary_column";
      pyVar1 = &doc->str_pool;
      if ((uVar6 < (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) ||
         (bVar21 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar1,&doc->alc,uVar6 + 1), bVar21))
      {
        pcVar13 = pyVar1->cur;
        pyVar1->cur = pcVar13 + uVar6 + 1;
      }
      else {
        pcVar13 = (char *)0x0;
      }
      if (pcVar13 == (char *)0x0) {
        pcVar13 = (char *)0x0;
      }
      else {
        switchD_015ff80e::default(pcVar13,pcVar5,uVar6);
        pcVar13[uVar6] = '\0';
      }
      pyVar16[1].uni.ptr = pcVar13;
      if (pcVar13 != (char *)0x0) {
        pyVar16[1].tag = uVar6 << 8 | 5;
        pyVar17 = pyVar16;
        if (0xff < uVar7) {
          lVar8 = *(long *)((pyVar19->uni).u64 + 0x10);
          pyVar17 = *(yyjson_mut_val **)(lVar8 + 0x10);
          *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar16;
        }
        pyVar16[1].next = pyVar17;
        pyVar16->next = pyVar16 + 1;
        (pyVar19->uni).str = (char *)pyVar16;
        pyVar19->tag = (uVar7 & 0xffffffffffffff00) + (ulong)(byte)pyVar19->tag + 0x100;
      }
    }
  }
  if (doc == (yyjson_mut_doc *)0x0) {
LAB_00cf388d:
    pyVar16 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar2 = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,&doc->alc,1), bVar21)) {
      pyVar16 = pyVar2->cur;
      pyVar2->cur = pyVar16 + 1;
    }
    else {
      pyVar16 = (yyjson_mut_val *)0x0;
    }
    if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00cf388d;
    pyVar16->tag = 0x70d;
    (pyVar16->uni).str = "columns";
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar2 = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,&doc->alc,1), bVar21)) {
      pyVar17 = pyVar2->cur;
      pyVar2->cur = pyVar17 + 1;
    }
    else {
      pyVar17 = (yyjson_mut_val *)0x0;
    }
    if (pyVar17 != (yyjson_mut_val *)0x0) {
      pyVar17->tag = 7;
      goto LAB_00cf2bb4;
    }
  }
  pyVar17 = (yyjson_mut_val *)0x0;
LAB_00cf2bb4:
  if ((pyVar19 == (yyjson_mut_val *)0x0) || ((~(uint)pyVar19->tag & 7) != 0)) {
    local_d8 = (yyjson_mut_val *)0x0;
  }
  else {
    if (pyVar16 == (yyjson_mut_val *)0x0) {
      bVar21 = false;
    }
    else {
      bVar21 = (pyVar16->tag & 7) == 5;
    }
    local_d8 = (yyjson_mut_val *)0x0;
    if ((pyVar17 != (yyjson_mut_val *)0x0) && (bVar21)) {
      uVar6 = pyVar19->tag;
      pyVar18 = pyVar16;
      if (0xff < uVar6) {
        lVar8 = *(long *)((pyVar19->uni).u64 + 0x10);
        pyVar18 = *(yyjson_mut_val **)(lVar8 + 0x10);
        *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar16;
      }
      pyVar17->next = pyVar18;
      pyVar16->next = pyVar17;
      (pyVar19->uni).str = (char *)pyVar16;
      pyVar19->tag = (uVar6 & 0xffffffffffffff00) + (uVar6 & 0xff) + 0x100;
      local_d8 = pyVar17;
    }
  }
  p_Var20 = (this->geometry_columns)._M_h._M_before_begin._M_nxt;
  if (p_Var20 != (_Hash_node_base *)0x0) {
    pyVar2 = &doc->val_pool;
    alc = &doc->alc;
    pyVar1 = &doc->str_pool;
    do {
      if (doc == (yyjson_mut_doc *)0x0) {
        pyVar19 = (yyjson_mut_val *)0x0;
      }
      else {
        __s = p_Var20[1]._M_nxt;
        pyVar19 = (yyjson_mut_val *)0x0;
        if (__s != (_Hash_node_base *)0x0) {
          sVar12 = strlen((char *)__s);
          if (((doc->val_pool).end != (doc->val_pool).cur) ||
             (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
            pyVar19 = pyVar2->cur;
            pyVar2->cur = pyVar19 + 1;
          }
          else {
            pyVar19 = (yyjson_mut_val *)0x0;
          }
          if (pyVar19 == (yyjson_mut_val *)0x0) {
            pyVar19 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar19->tag = sVar12 << 8 | 5;
            (pyVar19->uni).str = (char *)__s;
          }
        }
      }
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_00cf353f:
        pyVar16 = (yyjson_mut_val *)0x0;
      }
      else {
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar16 = pyVar2->cur;
          pyVar2->cur = pyVar16 + 1;
        }
        else {
          pyVar16 = (yyjson_mut_val *)0x0;
        }
        if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00cf353f;
        pyVar16->tag = 7;
      }
      if ((local_d8 == (yyjson_mut_val *)0x0) || ((~(uint)local_d8->tag & 7) != 0)) {
LAB_00cf2d7e:
        pyVar17 = (yyjson_mut_val *)0x0;
      }
      else {
        if (pyVar19 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar19->tag & 7) == 5;
        }
        if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00cf2d7e;
        pyVar17 = (yyjson_mut_val *)0x0;
        if (bVar21) {
          uVar6 = local_d8->tag;
          pyVar17 = pyVar19;
          if (0xff < uVar6) {
            lVar8 = *(long *)((local_d8->uni).u64 + 0x10);
            pyVar17 = *(yyjson_mut_val **)(lVar8 + 0x10);
            *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar19;
          }
          pyVar16->next = pyVar17;
          pyVar19->next = pyVar16;
          (local_d8->uni).str = (char *)pyVar19;
          local_d8->tag = (uVar6 & 0xff) + (uVar6 & 0xffffffffffffff00) + 0x100;
          pyVar17 = pyVar16;
        }
      }
      if (((doc != (yyjson_mut_doc *)0x0) && (pyVar17 != (yyjson_mut_val *)0x0)) &&
         ((~(uint)pyVar17->tag & 7) == 0)) {
        if ((1 < (ulong)(((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / 0x18)) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,2), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 2;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 != (yyjson_mut_val *)0x0) {
          uVar6 = pyVar17->tag;
          pyVar19->tag = 0x80d;
          (pyVar19->uni).str = "encoding";
          pyVar19[1].tag = 0x30d;
          pyVar19[1].uni.str = "WKB";
          pyVar16 = pyVar19;
          if (0xff < uVar6) {
            lVar8 = *(long *)((pyVar17->uni).u64 + 0x10);
            pyVar16 = *(yyjson_mut_val **)(lVar8 + 0x10);
            *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar19;
          }
          pyVar19[1].next = pyVar16;
          pyVar19->next = pyVar19 + 1;
          (pyVar17->uni).str = (char *)pyVar19;
          pyVar17->tag = (ulong)(byte)pyVar17->tag + (uVar6 & 0xffffffffffffff00) + 0x100;
        }
      }
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_00cf3546:
        pyVar19 = (yyjson_mut_val *)0x0;
      }
      else {
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 1;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 == (yyjson_mut_val *)0x0) goto LAB_00cf3546;
        pyVar19->tag = 0xe0d;
        (pyVar19->uni).str = "geometry_types";
      }
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_00cf354d:
        pyVar16 = (yyjson_mut_val *)0x0;
      }
      else {
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar16 = pyVar2->cur;
          pyVar2->cur = pyVar16 + 1;
        }
        else {
          pyVar16 = (yyjson_mut_val *)0x0;
        }
        if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00cf354d;
        pyVar16->tag = 6;
      }
      if ((pyVar17 == (yyjson_mut_val *)0x0) || ((~(uint)pyVar17->tag & 7) != 0)) {
LAB_00cf2f28:
        pyVar18 = (yyjson_mut_val *)0x0;
      }
      else {
        if (pyVar19 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar19->tag & 7) == 5;
        }
        if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00cf2f28;
        pyVar18 = (yyjson_mut_val *)0x0;
        if (bVar21) {
          uVar6 = pyVar17->tag;
          pyVar18 = pyVar19;
          if (0xff < uVar6) {
            lVar8 = *(long *)((pyVar17->uni).u64 + 0x10);
            pyVar18 = *(yyjson_mut_val **)(lVar8 + 0x10);
            *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar19;
          }
          pyVar16->next = pyVar18;
          pyVar19->next = pyVar16;
          (pyVar17->uni).str = (char *)pyVar19;
          pyVar17->tag = (uVar6 & 0xff) + (uVar6 & 0xffffffffffffff00) + 0x100;
          pyVar18 = pyVar16;
        }
      }
      p_Var14 = (_Rb_tree_node_base *)p_Var20[9]._M_nxt;
      if (p_Var14 != (_Rb_tree_node_base *)(p_Var20 + 7)) {
        do {
          pcVar13 = WKBGeometryTypes::ToString((WKBGeometryType)p_Var14[1]._M_color);
          if ((pyVar18 != (yyjson_mut_val *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
             ((pyVar18->tag & 7) == 6)) {
            if (doc == (yyjson_mut_doc *)0x0) {
              pyVar19 = (yyjson_mut_val *)0x0;
            }
            else {
              sVar12 = strlen(pcVar13);
              if (((doc->val_pool).end != (doc->val_pool).cur) ||
                 (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
                pyVar19 = pyVar2->cur;
                pyVar2->cur = pyVar19 + 1;
              }
              else {
                pyVar19 = (yyjson_mut_val *)0x0;
              }
              if (pyVar19 == (yyjson_mut_val *)0x0) {
                pyVar19 = (yyjson_mut_val *)0x0;
              }
              else {
                pyVar19->tag = sVar12 << 8 | 5;
                (pyVar19->uni).str = pcVar13;
              }
            }
            if (pyVar18 == (yyjson_mut_val *)0x0) {
              bVar21 = false;
            }
            else {
              bVar21 = (pyVar18->tag & 7) == 6;
            }
            if ((pyVar19 != (yyjson_mut_val *)0x0) && (bVar21)) {
              uVar6 = pyVar18->tag;
              pyVar18->tag = uVar6 + 0x100;
              pyVar16 = pyVar19;
              if (0xff < uVar6) {
                pyVar16 = *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10);
                *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10) = pyVar19;
              }
              pyVar19->next = pyVar16;
              (pyVar18->uni).u64 = (uint64_t)pyVar19;
            }
          }
          p_Var14 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var14);
        } while (p_Var14 != (_Rb_tree_node_base *)(p_Var20 + 7));
      }
      if (doc == (yyjson_mut_doc *)0x0) {
        pyVar19 = (yyjson_mut_val *)0x0;
      }
      else {
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 1;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 == (yyjson_mut_val *)0x0) {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar19->tag = 0x40d;
          (pyVar19->uni).str = "bbox";
        }
      }
      if (doc == (yyjson_mut_doc *)0x0) {
        pyVar16 = (yyjson_mut_val *)0x0;
      }
      else {
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar16 = pyVar2->cur;
          pyVar2->cur = pyVar16 + 1;
        }
        else {
          pyVar16 = (yyjson_mut_val *)0x0;
        }
        if (pyVar16 == (yyjson_mut_val *)0x0) {
          pyVar16 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar16->tag = 6;
        }
      }
      if ((pyVar17 == (yyjson_mut_val *)0x0) || ((~(uint)pyVar17->tag & 7) != 0)) {
LAB_00cf3168:
        pyVar18 = (yyjson_mut_val *)0x0;
      }
      else {
        if (pyVar19 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar19->tag & 7) == 5;
        }
        if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00cf3168;
        pyVar18 = (yyjson_mut_val *)0x0;
        if (bVar21) {
          uVar6 = pyVar17->tag;
          pyVar18 = pyVar19;
          if (0xff < uVar6) {
            lVar8 = *(long *)((pyVar17->uni).u64 + 0x10);
            pyVar18 = *(yyjson_mut_val **)(lVar8 + 0x10);
            *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar19;
          }
          pyVar16->next = pyVar18;
          pyVar19->next = pyVar16;
          (pyVar17->uni).str = (char *)pyVar19;
          pyVar17->tag = (uVar6 & 0xff) + (uVar6 & 0xffffffffffffff00) + 0x100;
          pyVar18 = pyVar16;
        }
      }
      if (((doc != (yyjson_mut_doc *)0x0) && (pyVar18 != (yyjson_mut_val *)0x0)) &&
         ((pyVar18->tag & 7) == 6)) {
        yVar4 = (yyjson_val_uni)p_Var20[0xc]._M_nxt;
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 1;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 != (yyjson_mut_val *)0x0) {
          pyVar19->tag = 0x14;
          pyVar19->uni = yVar4;
        }
        if (pyVar18 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar18->tag & 7) == 6;
        }
        if ((pyVar19 != (yyjson_mut_val *)0x0) && (bVar21)) {
          uVar6 = pyVar18->tag;
          pyVar18->tag = uVar6 + 0x100;
          pyVar16 = pyVar19;
          if (0xff < uVar6) {
            pyVar16 = *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10);
            *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10) = pyVar19;
          }
          pyVar19->next = pyVar16;
          (pyVar18->uni).str = (char *)pyVar19;
        }
      }
      if (((doc != (yyjson_mut_doc *)0x0) && (pyVar18 != (yyjson_mut_val *)0x0)) &&
         ((pyVar18->tag & 7) == 6)) {
        yVar4 = (yyjson_val_uni)p_Var20[0xe]._M_nxt;
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 1;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 != (yyjson_mut_val *)0x0) {
          pyVar19->tag = 0x14;
          pyVar19->uni = yVar4;
        }
        if (pyVar18 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar18->tag & 7) == 6;
        }
        if ((pyVar19 != (yyjson_mut_val *)0x0) && (bVar21)) {
          uVar6 = pyVar18->tag;
          pyVar18->tag = uVar6 + 0x100;
          pyVar16 = pyVar19;
          if (0xff < uVar6) {
            pyVar16 = *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10);
            *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10) = pyVar19;
          }
          pyVar19->next = pyVar16;
          (pyVar18->uni).str = (char *)pyVar19;
        }
      }
      if (((doc != (yyjson_mut_doc *)0x0) && (pyVar18 != (yyjson_mut_val *)0x0)) &&
         ((pyVar18->tag & 7) == 6)) {
        yVar4 = (yyjson_val_uni)p_Var20[0xd]._M_nxt;
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 1;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 != (yyjson_mut_val *)0x0) {
          pyVar19->tag = 0x14;
          pyVar19->uni = yVar4;
        }
        if (pyVar18 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar18->tag & 7) == 6;
        }
        if ((pyVar19 != (yyjson_mut_val *)0x0) && (bVar21)) {
          uVar6 = pyVar18->tag;
          pyVar18->tag = uVar6 + 0x100;
          pyVar16 = pyVar19;
          if (0xff < uVar6) {
            pyVar16 = *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10);
            *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10) = pyVar19;
          }
          pyVar19->next = pyVar16;
          (pyVar18->uni).str = (char *)pyVar19;
        }
      }
      if (((doc != (yyjson_mut_doc *)0x0) && (pyVar18 != (yyjson_mut_val *)0x0)) &&
         ((pyVar18->tag & 7) == 6)) {
        yVar4 = (yyjson_val_uni)p_Var20[0xf]._M_nxt;
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
          pyVar19 = pyVar2->cur;
          pyVar2->cur = pyVar19 + 1;
        }
        else {
          pyVar19 = (yyjson_mut_val *)0x0;
        }
        if (pyVar19 != (yyjson_mut_val *)0x0) {
          pyVar19->tag = 0x14;
          pyVar19->uni = yVar4;
        }
        if (pyVar18 == (yyjson_mut_val *)0x0) {
          bVar21 = false;
        }
        else {
          bVar21 = (pyVar18->tag & 7) == 6;
        }
        if ((pyVar19 != (yyjson_mut_val *)0x0) && (bVar21)) {
          uVar6 = pyVar18->tag;
          pyVar18->tag = uVar6 + 0x100;
          pyVar16 = pyVar19;
          if (0xff < uVar6) {
            pyVar16 = *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10);
            *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10) = pyVar19;
          }
          pyVar19->next = pyVar16;
          (pyVar18->uni).str = (char *)pyVar19;
        }
      }
      if (p_Var20[0x11]._M_nxt != (_Hash_node_base *)0x0) {
        pyVar15 = duckdb_yyjson::yyjson_read_opts
                            ((char *)p_Var20[0x10]._M_nxt,(usize)p_Var20[0x11]._M_nxt,0,
                             (yyjson_alc *)0x0,(yyjson_read_err *)0x0);
        if (pyVar15 == (yyjson_doc *)0x0) {
          duckdb_yyjson::yyjson_mut_doc_free(doc);
          this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          kv._0_8_ = &kv.key._M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&kv,"Failed to parse CRS JSON","");
          InvalidInputException::InvalidInputException(this_00,(string *)&kv);
          __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        pyVar19 = duckdb_yyjson::yyjson_val_mut_copy(doc,pyVar15->root);
        if (doc == (yyjson_mut_doc *)0x0) {
          pyVar16 = (yyjson_mut_val *)0x0;
        }
        else {
          if (((doc->val_pool).end != (doc->val_pool).cur) ||
             (bVar21 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar2,alc,1), bVar21)) {
            pyVar18 = pyVar2->cur;
            pyVar2->cur = pyVar18 + 1;
          }
          else {
            pyVar18 = (yyjson_mut_val *)0x0;
          }
          if ((8 < (ulong)((long)(doc->str_pool).end - (long)(doc->str_pool).cur)) ||
             (bVar21 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar1,alc,9), bVar21)) {
            pcVar13 = pyVar1->cur;
            pyVar1->cur = pcVar13 + 9;
          }
          else {
            pcVar13 = (char *)0x0;
          }
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)0x0;
          }
          else {
            builtin_strncpy(pcVar13,"projjson",9);
          }
          if (pyVar18 == (yyjson_mut_val *)0x0) {
            pyVar16 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar16 = (yyjson_mut_val *)0x0;
            if (pcVar13 != (char *)0x0) {
              pyVar18->tag = 0x80d;
              (pyVar18->uni).str = pcVar13;
              pyVar16 = pyVar18;
            }
          }
        }
        if ((pyVar17 != (yyjson_mut_val *)0x0) && ((~(uint)pyVar17->tag & 7) == 0)) {
          if (pyVar16 == (yyjson_mut_val *)0x0) {
            bVar21 = false;
          }
          else {
            bVar21 = (pyVar16->tag & 7) == 5;
          }
          if ((pyVar19 != (yyjson_mut_val *)0x0) && (bVar21)) {
            uVar6 = pyVar17->tag;
            pyVar18 = pyVar16;
            if (0xff < uVar6) {
              lVar8 = *(long *)((pyVar17->uni).u64 + 0x10);
              pyVar18 = *(yyjson_mut_val **)(lVar8 + 0x10);
              *(yyjson_mut_val **)(lVar8 + 0x10) = pyVar16;
            }
            pyVar19->next = pyVar18;
            pyVar16->next = pyVar19;
            (pyVar17->uni).u64 = (uint64_t)pyVar16;
            pyVar17->tag = (uVar6 & 0xff) + (uVar6 & 0xffffffffffffff00) + 0x100;
          }
        }
        p_Var9 = (pyVar15->alc).free;
        pvVar10 = (pyVar15->alc).ctx;
        (pyVar15->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (pyVar15->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (pyVar15->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (pyVar15->alc).ctx = (void *)0x0;
        if (pyVar15->str_pool != (char *)0x0) {
          (*p_Var9)(pvVar10,pyVar15->str_pool);
        }
        (*p_Var9)(pvVar10,pyVar15);
      }
      p_Var20 = p_Var20->_M_nxt;
    } while (p_Var20 != (_Hash_node_base *)0x0);
  }
  pcVar13 = duckdb_yyjson::yyjson_mut_write_opts(doc,0,(yyjson_alc *)0x0,&len,&err);
  if (pcVar13 != (char *)0x0) {
    duckdb_parquet::KeyValue::KeyValue(&kv);
    paVar3 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar3;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"geo","");
    duckdb_parquet::KeyValue::__set_key(&kv,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar3;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar13,pcVar13 + len);
    duckdb_parquet::KeyValue::__set_value(&kv,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    free(pcVar13);
    duckdb_yyjson::yyjson_mut_doc_free(doc);
    pFVar11 = local_a0;
    ::std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::push_back
              (&(local_a0->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,
               &kv);
    pFVar11->__isset = (_FileMetaData__isset)((byte)pFVar11->__isset | 1);
    duckdb_parquet::KeyValue::~KeyValue(&kv);
    return;
  }
  duckdb_yyjson::yyjson_mut_doc_free(doc);
  this_01 = (SerializationException *)__cxa_allocate_exception(0x10);
  kv._0_8_ = &kv.key._M_string_length;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&kv,"Failed to write JSON string: %s","");
  SerializationException::SerializationException<char_const*>(this_01,(string *)&kv,err.msg);
  __cxa_throw(this_01,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void GeoParquetFileMetadata::Write(duckdb_parquet::FileMetaData &file_meta_data) const {

	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	// Add the version
	yyjson_mut_obj_add_strncpy(doc, root, "version", version.c_str(), version.size());

	// Add the primary column
	yyjson_mut_obj_add_strncpy(doc, root, "primary_column", primary_geometry_column.c_str(),
	                           primary_geometry_column.size());

	// Add the columns
	const auto json_columns = yyjson_mut_obj_add_obj(doc, root, "columns");

	for (auto &column : geometry_columns) {
		const auto column_json = yyjson_mut_obj_add_obj(doc, json_columns, column.first.c_str());
		yyjson_mut_obj_add_str(doc, column_json, "encoding", "WKB");
		const auto geometry_types = yyjson_mut_obj_add_arr(doc, column_json, "geometry_types");
		for (auto &geometry_type : column.second.geometry_types) {
			const auto type_name = WKBGeometryTypes::ToString(geometry_type);
			yyjson_mut_arr_add_str(doc, geometry_types, type_name);
		}
		const auto bbox = yyjson_mut_obj_add_arr(doc, column_json, "bbox");
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_y);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_y);

		// If the CRS is present, add it
		if (!column.second.projjson.empty()) {
			const auto crs_doc = yyjson_read(column.second.projjson.c_str(), column.second.projjson.size(), 0);
			if (!crs_doc) {
				yyjson_mut_doc_free(doc);
				throw InvalidInputException("Failed to parse CRS JSON");
			}
			const auto crs_root = yyjson_doc_get_root(crs_doc);
			const auto crs_val = yyjson_val_mut_copy(doc, crs_root);
			const auto crs_key = yyjson_mut_strcpy(doc, "projjson");
			yyjson_mut_obj_add(column_json, crs_key, crs_val);
			yyjson_doc_free(crs_doc);
		}
	}

	yyjson_write_err err;
	size_t len;
	char *json = yyjson_mut_write_opts(doc, 0, nullptr, &len, &err);
	if (!json) {
		yyjson_mut_doc_free(doc);
		throw SerializationException("Failed to write JSON string: %s", err.msg);
	}

	// Create a string from the JSON
	duckdb_parquet::KeyValue kv;
	kv.__set_key("geo");
	kv.__set_value(string(json, len));

	// Free the JSON and the document
	free(json);
	yyjson_mut_doc_free(doc);

	file_meta_data.key_value_metadata.push_back(kv);
	file_meta_data.__isset.key_value_metadata = true;
}